

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

uint64_t read_pixels_raw(MultiPartInputFile *f)

{
  bool bVar1;
  ulong uVar2;
  logic_error *this;
  int *piVar3;
  Slice *pSVar4;
  Channel *pCVar5;
  runtime_error *this_00;
  MultiPartInputFile *in_RDI;
  ConstIterator e_1;
  ConstIterator c;
  int chanoffset;
  FrameBuffer frameBuffer;
  char *buf;
  char *data;
  int scanlinebytes;
  ConstIterator e;
  ConstIterator b;
  int bpp;
  int layercount;
  ChannelList *chans;
  InputPart part;
  char *outPtr;
  vector<char,_std::allocator<char>_> rawBuf;
  uint64_t ret;
  int linesread;
  int64_t h;
  int64_t w;
  Box2i *dw;
  Header *head;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  Slice local_130 [56];
  undefined8 local_f8;
  undefined8 local_f0;
  int local_e4;
  char local_e0 [48];
  char *local_b0;
  char *local_a8;
  int local_9c;
  undefined8 local_98;
  undefined8 local_90;
  int local_88;
  int local_84;
  undefined8 local_80;
  FrameBuffer local_78;
  uint64_t local_40;
  long local_30;
  long local_28;
  int *local_20;
  undefined8 local_18;
  MultiPartInputFile *local_10;
  uint64_t local_8;
  
  local_10 = in_RDI;
  local_18 = Imf_3_2::MultiPartInputFile::header((int)in_RDI);
  local_20 = (int *)Imf_3_2::Header::dataWindow();
  local_28 = (long)((local_20[2] - *local_20) + 1);
  local_30 = (long)((local_20[3] - local_20[1]) + 1);
  local_40 = 0;
  if (local_28 < 1) {
    local_8 = 0;
  }
  else {
    uVar2 = Imf_3_2::Header::hasTileDescription();
    if ((uVar2 & 1) != 0) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Tiled performance read test NYI");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    piVar3 = (int *)Imf_3_2::Header::lineOrder();
    if (*piVar3 == 1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"decreasing y not yet finished");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x107649);
    Imf_3_2::InputPart::InputPart((InputPart *)&local_78,local_10,0);
    local_80 = Imf_3_2::Header::channels();
    local_84 = 0;
    local_88 = 0;
    local_90 = Imf_3_2::ChannelList::begin();
    local_98 = Imf_3_2::ChannelList::end();
    while( true ) {
      bVar1 = Imf_3_2::operator!=((ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                  (ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      if (!bVar1) break;
      local_84 = local_84 + 1;
      pCVar5 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x107720);
      if (*(int *)pCVar5 == 1) {
        local_88 = local_88 + 2;
      }
      else {
        local_88 = local_88 + 4;
      }
      Imf_3_2::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    }
    local_9c = (int)local_28 * local_88;
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_a8 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x1077cc);
    local_b0 = local_a8 + (-(long)(local_20[1] * local_9c) - (long)(*local_20 * local_88));
    Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x10781e);
    local_e4 = 0;
    local_f0 = Imf_3_2::ChannelList::begin();
    local_f8 = Imf_3_2::ChannelList::end();
    while( true ) {
      bVar1 = Imf_3_2::operator!=((ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                  (ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      if (!bVar1) break;
      pSVar4 = (Slice *)Imf_3_2::ChannelList::ConstIterator::name((ConstIterator *)0x1078a0);
      pCVar5 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1078b4);
      in_stack_fffffffffffffe50 = 0;
      in_stack_fffffffffffffe48 = 1;
      Imf_3_2::Slice::Slice
                (local_130,*(PixelType *)pCVar5,local_b0 + local_e4,(long)local_88,(long)local_9c,1,
                 1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert(local_e0,pSVar4);
      pCVar5 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x10793d);
      if (*(int *)pCVar5 == 1) {
        local_e4 = local_e4 + 2;
      }
      else {
        local_e4 = local_e4 + 4;
      }
      Imf_3_2::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    }
    Imf_3_2::InputPart::setFrameBuffer(&local_78);
    Imf_3_2::InputPart::readPixels((int)&local_78,local_20[1]);
    Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1079ec);
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffe60);
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

static uint64_t
read_pixels_raw (MultiPartInputFile* f)
{
    auto&    head = f->header (0);
    auto&    dw   = head.dataWindow ();
    int64_t  w    = dw.max.x - dw.min.x + 1;
    int64_t  h    = dw.max.y - dw.min.y + 1;
    int      linesread;
    uint64_t ret = 0;

    if (w <= 0) return ret;

    if (head.hasTileDescription ())
        throw std::logic_error ("Tiled performance read test NYI");

    if (head.lineOrder () != DECREASING_Y)
    {
        std::vector<char>  rawBuf;
        const char*        outPtr;
        InputPart          part{*f, 0};
        const ChannelList& chans      = head.channels ();
        int                layercount = 0;
        int                bpp        = 0;

        for (auto b = chans.begin (), e = chans.end (); b != e; ++b)
        {
            ++layercount;
            if (b.channel ().type == HALF)
                bpp += 2;
            else
                bpp += 4;
        }

        int scanlinebytes = w * bpp;
        rawBuf.resize (h * scanlinebytes);
        char* data = rawBuf.data ();
        char* buf  = (char*) data - dw.min.x * bpp - dw.min.y * scanlinebytes;

        FrameBuffer frameBuffer;
        int         chanoffset = 0;
        for (auto c = chans.begin (), e = chans.end (); c != e; ++c)
        {
            frameBuffer.insert (
                c.name (),
                Slice (
                    c.channel ().type, buf + chanoffset, bpp, scanlinebytes));
            if (c.channel ().type == HALF)
                chanoffset += 2;
            else
                chanoffset += 4;
        }

        part.setFrameBuffer (frameBuffer);
        part.readPixels (dw.min.y, dw.max.y);
#if 0
        Compressor *comp = nullptr;
        try
        {
            if ( layercount == 0 )
                throw std::runtime_error( "channels" );
            comp = newCompressor( head.compression(), w * bpp, head );
            
            int linesread = comp->numScanLines();
            int bufSize = linesread * w * 4 * layercount;
            if ( bufSize == 0 )
                throw std::runtime_error( "bufsize" );
            rawBuf.resize( bufSize );

            // random or increasing
            for ( int y = dw.min.y; y <= dw.max.y; )
            {
                int pixDS = bufSize;
                part.rawPixelDataToBuffer( y, rawBuf.data(), pixDS );
                comp->uncompress( rawBuf.data(), pixDS, y, outPtr );
                y += linesread;
                ret += linesread * w;
            }
        }
        catch ( ... )
        {
            delete comp;
            throw;
        }
#endif
    }
    else
        throw std::runtime_error ("decreasing y not yet finished");
    return ret;
}